

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::computeTest(SPxSolverBase<double> *this)

{
  Status stat;
  ostream *poVar1;
  long lVar2;
  int iVar3;
  SPxOut *pSVar4;
  char *t;
  int iVar5;
  int i;
  long lVar6;
  double dVar7;
  ulong extraout_XMM0_Qb;
  Verbosity old_verbosity;
  undefined4 local_50;
  Verbosity local_4c;
  double local_48;
  ulong uStack_40;
  
  local_48 = leavetol(this);
  this->m_pricingViolCoUpToDate = true;
  this->m_pricingViolCo = 0.0;
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  iVar3 = (this->thevectors->set).thenum;
  iVar5 = (int)((double)iVar3 * this->sparsePricingFactor);
  local_48 = -local_48;
  uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
  for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
    stat = ((this->super_SPxBasisBase<double>).thedesc.stat)->data[lVar6];
    if (this->theRep * stat < 1) {
      dVar7 = test(this,(int)lVar6,stat);
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = dVar7;
      if (this->remainingRoundsEnterCo == 0) {
        if (local_48 <= dVar7) {
          (this->isInfeasibleCo).data[lVar6] = 0;
        }
        else {
          this->m_pricingViolCo = this->m_pricingViolCo - dVar7;
          DIdxSet::addIdx(&this->infeasibilitiesCo,(int)lVar6);
          (this->isInfeasibleCo).data[lVar6] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        if (iVar5 < (this->infeasibilitiesCo).super_IdxSet.num) {
          pSVar4 = this->spxout;
          if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
            local_50 = 4;
            local_4c = pSVar4->m_verbosity;
            (*pSVar4->_vptr_SPxOut[2])(pSVar4,&local_50);
            pSVar4 = soplex::operator<<(this->spxout," --- using dense pricing");
            std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4c);
          }
          this->remainingRoundsEnterCo = 5;
          this->sparsePricingEnterCo = false;
          (this->infeasibilitiesCo).super_IdxSet.num = 0;
        }
      }
      else if (dVar7 < local_48) {
        this->m_pricingViolCo = this->m_pricingViolCo - dVar7;
        this->m_numViol = this->m_numViol + 1;
      }
    }
    else {
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = 0.0;
      if (this->remainingRoundsEnterCo == 0) {
        (this->isInfeasibleCo).data[lVar6] = 0;
      }
    }
    iVar3 = (this->thevectors->set).thenum;
  }
  iVar3 = (this->infeasibilitiesCo).super_IdxSet.num;
  if ((iVar3 == 0) && (this->sparsePricingEnterCo == false)) {
    this->remainingRoundsEnterCo = this->remainingRoundsEnterCo + -1;
  }
  else if ((iVar3 <= iVar5) && (this->sparsePricingEnterCo == false)) {
    pSVar4 = this->spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (local_4c = pSVar4->m_verbosity, 3 < (int)local_4c)) {
      local_50 = 4;
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = this->spxout;
      iVar3 = *(int *)(pSVar4->m_streams[pSVar4->m_verbosity] +
                      *(long *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingEnter != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar4,t);
      pSVar4 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar1 = pSVar4->m_streams[pSVar4->m_verbosity];
      lVar6 = *(long *)poVar1;
      *(undefined8 *)(poVar1 + *(long *)(lVar6 + -0x18) + 0x10) = 6;
      *(uint *)(poVar1 + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(lVar6 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar1 + *(long *)(lVar6 + -0x18) + 8) = 4;
      pSVar4 = soplex::operator<<(pSVar4,(double)(this->infeasibilitiesCo).super_IdxSet.num /
                                         (double)(this->thevectors->set).thenum);
      poVar1 = pSVar4->m_streams[pSVar4->m_verbosity];
      lVar6 = *(long *)poVar1;
      lVar2 = *(long *)(lVar6 + -0x18);
      *(uint *)(poVar1 + lVar2 + 0x18) = *(uint *)(poVar1 + lVar2 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar1 + *(long *)(lVar6 + -0x18) + 8) = (long)iVar3;
      std::endl<char,std::char_traits<char>>(poVar1);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4c);
    }
    this->sparsePricingEnterCo = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}